

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

void __thiscall
fp::Algorithm::Navigate(Algorithm *this,array<int,_2UL> *current,array<int,_2UL> *next)

{
  ulong uVar1;
  ulong uVar2;
  element_type *peVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 uVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  uVar1 = *(ulong *)current->_M_elems;
  uVar2 = *(ulong *)next->_M_elems;
  uVar7 = uVar2 >> 0x20;
  iVar9 = (uint)uVar2 - (uint)uVar1;
  uVar6 = (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_LandBasedRobot)();
  bVar11 = iVar9 == -1;
  bVar12 = uVar7 == uVar1 >> 0x20;
  if (bVar12 && bVar11) {
    uVar8 = 0x4e;
    bVar4 = false;
LAB_00104a0f:
    bVar13 = false;
LAB_00104a11:
    bVar5 = false;
  }
  else {
    if (iVar9 == 1 && uVar7 == uVar1 >> 0x20) {
      uVar8 = 0x53;
      bVar4 = true;
      goto LAB_00104a0f;
    }
    iVar9 = (int)(uVar2 >> 0x20) - (int)(uVar1 >> 0x20);
    uVar10 = (uint)uVar2 ^ (uint)uVar1;
    bVar4 = false;
    if (iVar9 != -1 || uVar10 != 0) {
      bVar13 = uVar10 == 0 && iVar9 == 1;
      uVar8 = 0x45;
      bVar4 = false;
      if (uVar10 != 0 || iVar9 != 1) {
        uVar8 = 0;
      }
      goto LAB_00104a11;
    }
    uVar8 = 0x57;
    bVar5 = true;
    bVar13 = false;
  }
  uVar6 = uVar6 & 0xff;
  if (uVar6 < 0x53) {
    if (uVar6 == 0x45) {
      if (!bVar12 || !bVar11) {
        if (bVar4) goto LAB_00104ae3;
        if (!bVar13) {
          if (!bVar5) {
            return;
          }
          goto LAB_00104aac;
        }
        goto LAB_00104b10;
      }
    }
    else {
      if (uVar6 != 0x4e) {
        return;
      }
      if (bVar12 && bVar11) {
LAB_00104b10:
        bVar11 = API::wallFront();
        if (!bVar11) goto LAB_00104b2d;
        goto LAB_00104b19;
      }
      if (bVar4) goto LAB_00104aac;
      if (bVar13) goto LAB_00104ae3;
      if (!bVar5) {
        return;
      }
    }
LAB_00104a9d:
    bVar11 = API::wallLeft();
    if (bVar11) goto LAB_00104b19;
LAB_00104ab9:
    (*((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_LandBasedRobot[2])();
  }
  else {
    if (uVar6 == 0x53) {
      if (bVar12 && bVar11) goto LAB_00104aac;
      if (bVar4) goto LAB_00104b10;
      if (bVar13) goto LAB_00104a9d;
      if (!bVar5) {
        return;
      }
    }
    else {
      if (uVar6 != 0x57) {
        return;
      }
      if (!bVar12 || !bVar11) {
        if (bVar4) goto LAB_00104a9d;
        if (!bVar13) {
          if (!bVar5) {
            return;
          }
          goto LAB_00104b10;
        }
LAB_00104aac:
        (*((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_LandBasedRobot[2])();
        goto LAB_00104ab9;
      }
    }
LAB_00104ae3:
    bVar11 = API::wallRight();
    if (bVar11) {
LAB_00104b19:
      this->path_blocked = true;
      return;
    }
    (*((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_LandBasedRobot[3])();
  }
LAB_00104b2d:
  peVar3 = (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar3->_vptr_LandBasedRobot[1])(peVar3,uVar2 & 0xffffffff,uVar7,uVar8);
  return;
}

Assistant:

void fp::Algorithm::Navigate(std::array<int, 2> &current, std::array<int, 2> &next) {
    int x{}, y{};
    char curr_direction{};
    char direction_togo{};

    //---> Step 01: Extract the current Node and Next Node <---//
    std::array<int, 2> node_curr{current}, node_next{next};

    //---> Step 02: Compute the togo direction <---//
    x = node_next[0] - node_curr[0];
    y = node_next[1] - node_curr[1];
    curr_direction = this->robot_->GetDirection();

    if (x == -1 && y == 0) direction_togo = 'N';
    else if (x == 1 && y == 0) direction_togo = 'S';
    else if (x == 0 && y == -1) direction_togo = 'W';
    else if (x == 0 && y == 1) direction_togo = 'E';

    //---> Step 03: Navigate the Robot and update new location and direction info <---//
    if (curr_direction == 'N') {
        if (direction_togo == 'N') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'E') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        }
    } else if (curr_direction == 'S') {
        if (direction_togo == 'N') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'S') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        }
    } else if (curr_direction == 'E') {
        if (direction_togo == 'N') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        } else if (direction_togo == 'W') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        }
    } else if (curr_direction == 'W') {
        if (direction_togo == 'N') {
            if (!fp::API::wallRight()) {
                this->robot_->TurnRight();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'S') {
            if (!fp::API::wallLeft()) {
                this->robot_->TurnLeft();
                this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            } else this->path_blocked = true;
        } else if (direction_togo == 'E') {
            this->robot_->TurnLeft();
            this->robot_->TurnLeft();
            this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
        } else if (direction_togo == 'W') {
            if (!fp::API::wallFront()) this->robot_->MoveForward(node_next[0], node_next[1], direction_togo);
            else this->path_blocked = true;
        }
    }
}